

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int delete_property(JSContext *ctx,JSObject *p,JSAtom atom)

{
  JSShape *pJVar1;
  JSProperty *pJVar2;
  undefined8 *puVar3;
  byte bVar4;
  uint16_t uVar5;
  JSVarRef **ppJVar6;
  JSVarRef *pJVar7;
  list_head *plVar8;
  list_head *plVar9;
  JSRuntime *pJVar10;
  JSClassExoticMethods *pJVar11;
  _func_int_JSContext_ptr_JSValue_JSAtom *p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  JSObject *pJVar15;
  int64_t iVar16;
  bool bVar17;
  BOOL BVar18;
  int iVar19;
  uint uVar20;
  JSShape *pJVar21;
  JSProperty *pJVar22;
  char cVar23;
  uint uVar24;
  JSShape *pJVar25;
  JSShapeProperty *pJVar26;
  JSProperty *pJVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  JSValue v;
  JSValue JVar34;
  JSShapeProperty *pr;
  uint32_t idx;
  uint local_70;
  JSShapeProperty *local_68;
  uint local_5c;
  ulong local_58;
  JSValueUnion local_50;
  void *local_48;
  ulong local_40;
  size_t local_38;
  
  do {
    pJVar21 = p->shape;
    uVar31 = ~(ulong)(pJVar21->prop_hash_mask & atom);
    uVar32 = (ulong)(uint)(&(pJVar21->header).ref_count)[uVar31];
    if (uVar32 != 0) {
      pJVar21 = pJVar21 + 1;
      local_68 = (JSShapeProperty *)((long)pJVar21 + uVar32 * 8 + -8);
      if (*(JSAtom *)((long)pJVar21 + uVar32 * 8 + -4) == atom) {
        pJVar26 = (JSShapeProperty *)0x0;
LAB_00122697:
        lVar33 = uVar32 - 1;
        if ((local_68->field_0x3 & 4) == 0) {
          return 0;
        }
        uVar32 = (ulong)((long)pJVar26 - (long)pJVar21) >> 3 & 0xffffffff;
        if (pJVar26 == (JSShapeProperty *)0x0) {
          uVar32 = 0;
        }
        iVar19 = js_shape_prepare_update(ctx,p,&local_68);
        if (iVar19 != 0) {
          return -1;
        }
        pJVar21 = p->shape;
        if (pJVar26 == (JSShapeProperty *)0x0) {
          (&(pJVar21->header).ref_count)[uVar31] = *(uint *)local_68 & 0x3ffffff;
        }
        else {
          (&pJVar21[1].header.ref_count)[uVar32 * 2] =
               (&pJVar21[1].header.ref_count)[uVar32 * 2] & 0xfc000000U |
               *(uint *)local_68 & 0x3ffffff;
        }
        pJVar21->deleted_prop_count = pJVar21->deleted_prop_count + 1;
        pJVar22 = p->prop;
        free_property(ctx->rt,pJVar22 + lVar33,*(uint *)local_68 >> 0x1a);
        JS_FreeAtom(ctx,local_68->atom);
        *(uint *)local_68 = *(uint *)local_68 & 0x3ffffff;
        local_68->atom = 0;
        *(undefined4 *)&pJVar22[lVar33].u = 0;
        pJVar22[lVar33].u.value.tag = 3;
        if (pJVar21->deleted_prop_count < 8) {
          return 1;
        }
        if ((uint)pJVar21->prop_count >> 1 <= (uint)pJVar21->deleted_prop_count) {
          pJVar21 = p->shape;
          uVar24 = pJVar21->prop_count - pJVar21->deleted_prop_count;
          uVar30 = 2;
          if (2 < (int)uVar24) {
            uVar30 = uVar24;
          }
          uVar24 = pJVar21->prop_hash_mask + 1;
          do {
            uVar20 = uVar24;
            local_58 = (ulong)uVar20;
            uVar24 = uVar20 >> 1;
          } while (uVar30 <= uVar20 >> 1);
          local_38 = local_58 * 4;
          local_48 = js_malloc(ctx,local_38 + (ulong)uVar30 * 8 + 0x40);
          if (local_48 != (void *)0x0) {
            pJVar1 = (JSShape *)((long)local_48 + local_58 * 4);
            plVar8 = (pJVar21->header).link.prev;
            plVar9 = (pJVar21->header).link.next;
            plVar8->next = plVar9;
            plVar9->prev = plVar8;
            (pJVar21->header).link.prev = (list_head *)0x0;
            (pJVar21->header).link.next = (list_head *)0x0;
            uVar13 = *(undefined8 *)&pJVar21->prop_hash_mask;
            uVar14 = *(undefined8 *)&pJVar21->prop_count;
            pJVar15 = pJVar21->proto;
            puVar3 = (undefined8 *)((long)local_48 + local_58 * 4 + 0x30);
            *puVar3 = pJVar21->shape_hash_next;
            puVar3[1] = pJVar15;
            puVar3 = (undefined8 *)((long)local_48 + local_58 * 4 + 0x20);
            *puVar3 = uVar13;
            puVar3[1] = uVar14;
            uVar13 = *(undefined8 *)&pJVar21->header;
            plVar8 = (pJVar21->header).link.prev;
            uVar14 = *(undefined8 *)&pJVar21->is_hashed;
            puVar3 = (undefined8 *)((long)local_48 + local_58 * 4 + 0x10);
            *puVar3 = (pJVar21->header).link.next;
            puVar3[1] = uVar14;
            puVar3 = (undefined8 *)((long)local_48 + local_58 * 4);
            *puVar3 = uVar13;
            puVar3[1] = plVar8;
            plVar8 = (list_head *)((long)local_48 + local_58 * 4 + 8);
            pJVar10 = ctx->rt;
            plVar9 = (pJVar10->gc_obj_list).prev;
            plVar9->next = plVar8;
            *(list_head **)((long)local_48 + local_58 * 4 + 8) = plVar9;
            *(list_head **)((long)local_48 + local_58 * 4 + 0x10) = &pJVar10->gc_obj_list;
            (pJVar10->gc_obj_list).prev = plVar8;
            uVar24 = 0;
            local_40 = (ulong)uVar30;
            memset(local_48,0,local_38);
            if (*(int *)((long)local_48 + local_58 * 4 + 0x28) != 0) {
              pJVar22 = p->prop;
              pJVar25 = pJVar1 + 1;
              uVar31 = 0;
              uVar24 = 0;
              pJVar27 = pJVar22;
              do {
                iVar19 = *(int *)(&pJVar21[1].header.field_0x4 + uVar31 * 8);
                if (iVar19 != 0) {
                  *(int *)&(pJVar25->header).field_0x4 = iVar19;
                  uVar28 = (&pJVar21[1].header.ref_count)[uVar31 * 2] & 0xfc000000;
                  (pJVar25->header).ref_count = (pJVar25->header).ref_count & 0x3ffffffU | uVar28;
                  uVar29 = ~(ulong)(*(uint *)(&pJVar21[1].header.field_0x4 + uVar31 * 8) &
                                   uVar20 - 1);
                  (pJVar25->header).ref_count =
                       (&(pJVar1->header).ref_count)[uVar29] & 0x3ffffffU | uVar28;
                  uVar32 = (ulong)uVar24;
                  uVar24 = uVar24 + 1;
                  (&(pJVar1->header).ref_count)[uVar29] = uVar24;
                  iVar16 = (pJVar27->u).value.tag;
                  pJVar2 = pJVar22 + uVar32;
                  (pJVar2->u).value.u = (pJVar27->u).value.u;
                  (pJVar2->u).value.tag = iVar16;
                  pJVar25 = (JSShape *)&(pJVar25->header).link;
                }
                uVar31 = uVar31 + 1;
                pJVar27 = pJVar27 + 1;
              } while (uVar31 < (uint)pJVar1->prop_count);
            }
            pJVar1->prop_hash_mask = uVar20 - 1;
            pJVar1->prop_size = uVar30;
            pJVar1->deleted_prop_count = 0;
            pJVar1->prop_count = uVar24;
            p->shape = pJVar1;
            (*(ctx->rt->mf).js_free)
                      (&ctx->rt->malloc_state,
                       &(pJVar21->header).ref_count + ~(ulong)pJVar21->prop_hash_mask);
            pJVar22 = (JSProperty *)js_realloc(ctx,p->prop,local_40 << 4);
            if (pJVar22 != (JSProperty *)0x0) {
              p->prop = pJVar22;
            }
          }
        }
        goto LAB_0012297a;
      }
      while (pJVar26 = local_68, uVar32 = (ulong)*(uint *)pJVar26 & 0x3ffffff, local_68 = pJVar26,
            (*(uint *)pJVar26 & 0x3ffffff) != 0) {
        local_68 = (JSShapeProperty *)((long)pJVar21 + uVar32 * 8 + -8);
        if (*(JSAtom *)((long)pJVar21 + uVar32 * 8 + -4) == atom) goto LAB_00122697;
      }
    }
    bVar4 = (p->field_0).header.dummy1;
    if ((bVar4 & 4) == 0) goto LAB_0012297a;
    if ((bVar4 & 8) == 0) {
      pJVar11 = ctx->rt->class_array[(p->field_0).header.dummy2].exotic;
      bVar17 = true;
      if ((pJVar11 != (JSClassExoticMethods *)0x0) &&
         (p_Var12 = pJVar11->delete_property,
         p_Var12 != (_func_int_JSContext_ptr_JSValue_JSAtom *)0x0)) {
        JVar34.tag = -1;
        JVar34.u.ptr = p;
        local_70 = (*p_Var12)(ctx,JVar34,atom);
        bVar17 = false;
      }
      if (!bVar17) {
        return local_70;
      }
      goto LAB_0012297a;
    }
    BVar18 = JS_AtomIsArrayIndex(ctx,&local_5c,atom);
    uVar30 = local_5c;
    cVar23 = '\0';
    if (BVar18 != 0) {
      uVar24 = (p->u).array.count;
      if (local_5c < uVar24) {
        uVar5 = (p->field_0).header.dummy2;
        if ((uVar5 == 8) || (uVar5 == 2)) {
          if (local_5c == uVar24 - 1) {
            ppJVar6 = (p->u).func.var_refs;
            local_50 = (JSValueUnion)((JSValueUnion *)(ppJVar6 + (ulong)local_5c * 2))->ptr;
            pJVar7 = ppJVar6[(ulong)local_5c * 2 + 1];
            if ((0xfffffff4 < (uint)pJVar7) &&
               (iVar19 = *local_50.ptr, *(int *)local_50.ptr = iVar19 + -1, iVar19 < 2)) {
              v.tag = (int64_t)pJVar7;
              v.u.ptr = local_50.ptr;
              __JS_FreeValueRT(ctx->rt,v);
            }
            (p->u).array.count = uVar30;
            cVar23 = '\x01';
            local_70 = 1;
          }
          else {
            iVar19 = convert_fast_array_to_array(ctx,p);
            cVar23 = (iVar19 == 0) + '\x01';
            local_70 = local_70 | -(uint)(iVar19 != 0);
          }
        }
        else {
          local_70 = 0;
          cVar23 = '\x01';
        }
      }
    }
  } while (cVar23 == '\x02');
  if (cVar23 == '\0') {
LAB_0012297a:
    local_70 = 1;
  }
  return local_70;
}

Assistant:

static int delete_property(JSContext *ctx, JSObject *p, JSAtom atom)
{
    JSShape *sh;
    JSShapeProperty *pr, *lpr, *prop;
    JSProperty *pr1;
    uint32_t lpr_idx;
    intptr_t h, h1;

 redo:
    sh = p->shape;
    h1 = atom & sh->prop_hash_mask;
    h = prop_hash_end(sh)[-h1 - 1];
    prop = get_shape_prop(sh);
    lpr = NULL;
    lpr_idx = 0;   /* prevent warning */
    while (h != 0) {
        pr = &prop[h - 1];
        if (likely(pr->atom == atom)) {
            /* found ! */
            if (!(pr->flags & JS_PROP_CONFIGURABLE))
                return FALSE;
            /* realloc the shape if needed */
            if (lpr)
                lpr_idx = lpr - get_shape_prop(sh);
            if (js_shape_prepare_update(ctx, p, &pr))
                return -1;
            sh = p->shape;
            /* remove property */
            if (lpr) {
                lpr = get_shape_prop(sh) + lpr_idx;
                lpr->hash_next = pr->hash_next;
            } else {
                prop_hash_end(sh)[-h1 - 1] = pr->hash_next;
            }
            sh->deleted_prop_count++;
            /* free the entry */
            pr1 = &p->prop[h - 1];
            free_property(ctx->rt, pr1, pr->flags);
            JS_FreeAtom(ctx, pr->atom);
            /* put default values */
            pr->flags = 0;
            pr->atom = JS_ATOM_NULL;
            pr1->u.value = JS_UNDEFINED;

            /* compact the properties if too many deleted properties */
            if (sh->deleted_prop_count >= 8 &&
                sh->deleted_prop_count >= ((unsigned)sh->prop_count / 2)) {
                compact_properties(ctx, p);
            }
            return TRUE;
        }
        lpr = pr;
        h = pr->hash_next;
    }

    if (p->is_exotic) {
        if (p->fast_array) {
            uint32_t idx;
            if (JS_AtomIsArrayIndex(ctx, &idx, atom) &&
                idx < p->u.array.count) {
                if (p->class_id == JS_CLASS_ARRAY ||
                    p->class_id == JS_CLASS_ARGUMENTS) {
                    /* Special case deleting the last element of a fast Array */
                    if (idx == p->u.array.count - 1) {
                        JS_FreeValue(ctx, p->u.array.u.values[idx]);
                        p->u.array.count = idx;
                        return TRUE;
                    }
                    if (convert_fast_array_to_array(ctx, p))
                        return -1;
                    goto redo;
                } else {
                    return FALSE;
                }
            }
        } else {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em && em->delete_property) {
                return em->delete_property(ctx, JS_MKPTR(JS_TAG_OBJECT, p), atom);
            }
        }
    }
    /* not found */
    return TRUE;
}